

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O0

void __thiscall
units::detail::unit_data::unit_data
          (unit_data *this,int meters,int kilograms,int seconds,int amperes,int kelvins,int moles,
          int candelas,int currencys,int counts,int radians,uint per_unit,uint iflag,uint eflag,
          uint equation)

{
  int kelvins_local;
  int amperes_local;
  int seconds_local;
  int kilograms_local;
  int meters_local;
  unit_data *this_local;
  
  *this = (unit_data)((uint)*this & 0xfffffff0 | meters & 0xfU);
  *this = (unit_data)((uint)*this & 0xffffff0f | (seconds & 0xfU) << 4);
  *this = (unit_data)((uint)*this & 0xfffff8ff | (kilograms & 7U) << 8);
  *this = (unit_data)((uint)*this & 0xffffc7ff | (amperes & 7U) << 0xb);
  *this = (unit_data)((uint)*this & 0xffff3fff | (candelas & 3U) << 0xe);
  *this = (unit_data)((uint)*this & 0xfff8ffff | (kelvins & 7U) << 0x10);
  *this = (unit_data)((uint)*this & 0xffe7ffff | (moles & 3U) << 0x13);
  *this = (unit_data)((uint)*this & 0xff1fffff | (radians & 7U) << 0x15);
  *this = (unit_data)((uint)*this & 0xfcffffff | (currencys & 3U) << 0x18);
  *this = (unit_data)((uint)*this & 0xf3ffffff | (counts & 3U) << 0x1a);
  *this = (unit_data)((uint)*this & 0xefffffff | (per_unit & 1) << 0x1c);
  *this = (unit_data)((uint)*this & 0xdfffffff | (iflag & 1) << 0x1d);
  *this = (unit_data)((uint)*this & 0xbfffffff | (eflag & 1) << 0x1e);
  *this = (unit_data)((uint)*this & 0x7fffffff | equation << 0x1f);
  return;
}

Assistant:

constexpr unit_data(
            int meters,
            int kilograms,
            int seconds,
            int amperes,
            int kelvins,
            int moles,
            int candelas,
            int currencys,
            int counts,
            int radians,
            unsigned int per_unit,
            unsigned int iflag,
            unsigned int eflag,
            unsigned int equation) :
            meter_(meters), second_(seconds), kilogram_(kilograms),
            ampere_(amperes), candela_(candelas), kelvin_(kelvins),
            mole_(moles), radians_(radians), currency_(currencys),
            count_(counts), per_unit_(per_unit), i_flag_(iflag), e_flag_(eflag),
            equation_(equation)
        {
        }